

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsInterface.cpp
# Opt level: O2

HighsStatus __thiscall
Highs::getDualRayInterface(Highs *this,bool *has_dual_ray,double *dual_ray_value)

{
  HighsHessian *this_00;
  HighsLogOptions *pHVar1;
  HighsRayRecord *this_01;
  vector<double,_std::allocator<double>_> *this_02;
  byte bVar2;
  uint uVar3;
  int iVar4;
  pointer pdVar5;
  HighsStatus HVar6;
  byte bVar7;
  size_type __n;
  ulong uVar8;
  byte bVar9;
  ulong uVar10;
  allocator local_1ae;
  bool solve_relaxation;
  HighsInt local_1ac;
  HighsHessian zero_hessian;
  HighsRayRecord primal_ray_record;
  vector<double,_std::allocator<double>_> col_cost;
  vector<double,_std::allocator<double>_> zero_costs;
  string presolve;
  HighsHessian hessian;
  HighsHessian local_80;
  
  uVar3 = (this->model_).lp_.num_row_;
  __n = (size_type)(int)uVar3;
  if (__n == 0) {
    return kOk;
  }
  bVar9 = (this->ekk_instance_).status_.has_invert;
  *has_dual_ray = (this->ekk_instance_).dual_ray_record_.index != -1;
  col_cost.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  col_cost.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  col_cost.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  HighsHessian::HighsHessian(&hessian);
  presolve._M_dataplus._M_p = (pointer)&presolve.field_2;
  presolve._M_string_length = 0;
  presolve.field_2._M_local_buf[0] = '\0';
  if (dual_ray_value == (double *)0x0) {
    HVar6 = kOk;
  }
  else {
    this_00 = &(this->model_).hessian_;
    local_1ac = (this->model_).hessian_.dim_;
    bVar2 = *has_dual_ray;
    HVar6 = kOk;
    bVar7 = bVar2 & bVar9;
    if (bVar7 == 0) {
      pHVar1 = &(this->options_).super_HighsOptionsStruct.log_options;
      if (this->model_status_ == kOptimal) {
        HVar6 = kOk;
        highsLogUser(pHVar1,kInfo,"Model status is optimal, so no dual ray is available\n");
        goto LAB_002527c6;
      }
      highsLogUser(pHVar1,kInfo,"Solving LP to try to compute dual ray\n");
      std::vector<double,_std::allocator<double>_>::operator=
                (&col_cost,&(this->model_).lp_.col_cost_);
      if (local_1ac != 0) {
        HighsHessian::operator=(&hessian,this_00);
      }
      std::__cxx11::string::string
                ((string *)&zero_hessian,"presolve",(allocator *)&primal_ray_record);
      getOptionValue(this,(string *)&zero_hessian,&presolve);
      std::__cxx11::string::~string((string *)&zero_hessian);
      std::__cxx11::string::string
                ((string *)&zero_hessian,"solve_relaxation",(allocator *)&primal_ray_record);
      getOptionValue(this,(string *)&zero_hessian,&solve_relaxation);
      std::__cxx11::string::~string((string *)&zero_hessian);
      zero_costs.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
      ._M_start = (pointer)0x0;
      zero_costs.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
      ._M_finish = (pointer)0x0;
      zero_costs.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
      ._M_end_of_storage = (pointer)0x0;
      zero_hessian.dim_ = 0;
      zero_hessian.format_ = 0;
      std::vector<double,_std::allocator<double>_>::_M_fill_assign
                (&zero_costs,(long)(this->model_).lp_.num_col_,(value_type_conflict1 *)&zero_hessian
                );
      this_01 = &(this->ekk_instance_).primal_ray_record_;
      HighsRayRecord::getRayRecord(&primal_ray_record,this_01);
      changeColsCost(this,0,(this->model_).lp_.num_col_ + -1,
                     zero_costs.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start);
      HighsRayRecord::setRayRecord(this_01,&primal_ray_record);
      if (local_1ac != 0) {
        HighsHessian::HighsHessian(&zero_hessian);
        HighsHessian::HighsHessian(&local_80,&zero_hessian);
        passHessian(this,&local_80);
        HighsHessian::~HighsHessian(&local_80);
        HighsHessian::~HighsHessian(&zero_hessian);
      }
      std::__cxx11::string::string((string *)&zero_hessian,"presolve",&local_1ae);
      setOptionValue(this,(string *)&zero_hessian,&::kHighsOffString_abi_cxx11_);
      std::__cxx11::string::~string((string *)&zero_hessian);
      std::__cxx11::string::string((string *)&zero_hessian,"solve_relaxation",&local_1ae);
      setOptionValue(this,(string *)&zero_hessian,true);
      std::__cxx11::string::~string((string *)&zero_hessian);
      HVar6 = run(this);
      *has_dual_ray = (this->ekk_instance_).dual_ray_record_.index != -1;
      bVar9 = (this->ekk_instance_).status_.has_invert;
      std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
                (&primal_ray_record.value.super__Vector_base<double,_std::allocator<double>_>);
      std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
                (&zero_costs.super__Vector_base<double,_std::allocator<double>_>);
      bVar2 = *has_dual_ray;
    }
    if ((bVar2 & 1) == 0) {
      HVar6 = kOk;
      highsLogUser(&(this->options_).super_HighsOptionsStruct.log_options,kInfo,
                   "No dual ray found\n");
    }
    else {
      this_02 = &(this->ekk_instance_).dual_ray_record_.value;
      if ((this->ekk_instance_).dual_ray_record_.value.
          super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
          _M_finish ==
          (this->ekk_instance_).dual_ray_record_.value.
          super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
          _M_start) {
        pHVar1 = &(this->options_).super_HighsOptionsStruct.log_options;
        if (bVar9 == 0) {
          highsLogUser(pHVar1,kError,"No LP invertible representation to compute dual ray\n");
          HVar6 = kError;
        }
        else {
          highsLogUser(pHVar1,kInfo,"Solving linear system to compute dual ray\n");
          zero_hessian.dim_ = 0;
          zero_hessian.format_ = 0;
          zero_hessian.start_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          zero_hessian.start_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          iVar4 = (this->ekk_instance_).dual_ray_record_.index;
          primal_ray_record.index = 0;
          primal_ray_record.sign = 0;
          std::vector<double,_std::allocator<double>_>::_M_fill_assign
                    ((vector<double,_std::allocator<double>_> *)&zero_hessian,__n,
                     (value_type_conflict1 *)&primal_ray_record);
          *(double *)(zero_hessian._0_8_ + (long)iVar4 * 8) =
               (double)(this->ekk_instance_).dual_ray_record_.sign;
          basisSolveInterface(this,(vector<double,_std::allocator<double>_> *)&zero_hessian,
                              dual_ray_value,(HighsInt *)0x0,(HighsInt *)0x0,true);
          std::vector<double,_std::allocator<double>_>::resize(this_02,__n);
          pdVar5 = (this_02->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                   super__Vector_impl_data._M_start;
          uVar10 = 0;
          uVar8 = (ulong)uVar3;
          if ((int)uVar3 < 1) {
            uVar8 = uVar10;
          }
          for (; uVar8 != uVar10; uVar10 = uVar10 + 1) {
            pdVar5[uVar10] = dual_ray_value[uVar10];
          }
          std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
                    ((_Vector_base<double,_std::allocator<double>_> *)&zero_hessian);
        }
      }
      else {
        uVar10 = 0;
        highsLogUser(&(this->options_).super_HighsOptionsStruct.log_options,kInfo,
                     "Copying known dual ray\n");
        pdVar5 = (this_02->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        uVar8 = (ulong)uVar3;
        if ((int)uVar3 < 1) {
          uVar8 = uVar10;
        }
        for (; uVar8 != uVar10; uVar10 = uVar10 + 1) {
          dual_ray_value[uVar10] = pdVar5[uVar10];
        }
      }
    }
    if (bVar7 == 0) {
      std::vector<double,_std::allocator<double>_>::operator=
                (&(this->model_).lp_.col_cost_,&col_cost);
      if (local_1ac != 0) {
        HighsHessian::operator=(this_00,&hessian);
      }
      std::__cxx11::string::string
                ((string *)&zero_hessian,"presolve",(allocator *)&primal_ray_record);
      setOptionValue(this,(string *)&zero_hessian,&presolve);
      std::__cxx11::string::~string((string *)&zero_hessian);
      std::__cxx11::string::string
                ((string *)&zero_hessian,"solve_relaxation",(allocator *)&primal_ray_record);
      setOptionValue(this,(string *)&zero_hessian,solve_relaxation);
      std::__cxx11::string::~string((string *)&zero_hessian);
      (this->info_).super_HighsInfoStruct.dual_solution_status = 0;
      (this->info_).super_HighsInfoStruct.objective_function_value = 0.0;
      (this->info_).super_HighsInfoStruct.num_dual_infeasibilities = -1;
      (this->info_).super_HighsInfoStruct.max_dual_infeasibility = INFINITY;
      (this->info_).super_HighsInfoStruct.sum_dual_infeasibilities = INFINITY;
      (this->info_).super_HighsInfoStruct.max_complementarity_violation = INFINITY;
      (this->info_).super_HighsInfoStruct.sum_complementarity_violations = INFINITY;
      if (*has_dual_ray == false) {
        this->model_status_ = kMin;
      }
    }
  }
LAB_002527c6:
  std::__cxx11::string::~string((string *)&presolve);
  HighsHessian::~HighsHessian(&hessian);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&col_cost.super__Vector_base<double,_std::allocator<double>_>);
  return HVar6;
}

Assistant:

HighsStatus Highs::getDualRayInterface(bool& has_dual_ray,
                                       double* dual_ray_value) {
  HighsStatus return_status = HighsStatus::kOk;
  HighsLp& lp = model_.lp_;
  HighsInt num_row = lp.num_row_;
  // For an LP with no rows the dual ray is vacuous
  if (num_row == 0) return return_status;
  bool has_invert = ekk_instance_.status_.has_invert;
  assert(!lp.is_moved_);
  has_dual_ray = ekk_instance_.dual_ray_record_.index != kNoRayIndex;

  // Declare identifiers to save column costs, integrality, any Hessian and the
  // presolve setting, and a flag to know when they should be
  // recovered
  std::vector<double> col_cost;
  HighsHessian hessian;
  bool solve_relaxation;
  std::string presolve;
  bool solve_feasibility_problem = false;
  const bool is_qp = model_.isQp();

  if (dual_ray_value != NULL) {
    // User wants a dual ray whatever
    if (!has_dual_ray || !has_invert) {
      // No dual ray is known, or no INVERT to compute it
      //
      // No point in trying to get a dual ray if the model status is
      // optimal
      if (this->model_status_ == HighsModelStatus::kOptimal) {
        highsLogUser(options_.log_options, HighsLogType::kInfo,
                     "Model status is optimal, so no dual ray is available\n");
        return return_status;
      }
      highsLogUser(options_.log_options, HighsLogType::kInfo,
                   "Solving LP to try to compute dual ray\n");
      // Save the column costs, integrality, any Hessian and the
      // presolve setting
      col_cost = lp.col_cost_;
      if (is_qp) hessian = model_.hessian_;
      this->getOptionValue("presolve", presolve);
      this->getOptionValue("solve_relaxation", solve_relaxation);
      solve_feasibility_problem = true;
      // Zero the costs, integrality and Hessian
      std::vector<double> zero_costs;
      zero_costs.assign(lp.num_col_, 0);
      // Take a copy of the primal ray record, since this will be
      // cleared by calling changeColsCost
      HighsRayRecord primal_ray_record =
          this->ekk_instance_.primal_ray_record_.getRayRecord();
      HighsStatus status =
          this->changeColsCost(0, lp.num_col_ - 1, zero_costs.data());
      assert(status == HighsStatus::kOk);
      // Reinstate the primal ray record
      this->ekk_instance_.primal_ray_record_.setRayRecord(primal_ray_record);
      if (is_qp) {
        HighsHessian zero_hessian;
        this->passHessian(zero_hessian);
      }
      this->setOptionValue("presolve", kHighsOffString);
      this->setOptionValue("solve_relaxation", true);
      HighsStatus call_status = this->run();
      if (call_status != HighsStatus::kOk) return_status = call_status;
      has_dual_ray = ekk_instance_.dual_ray_record_.index != kNoRayIndex;
      has_invert = ekk_instance_.status_.has_invert;
      assert(has_invert);
    }
    if (has_dual_ray) {
      if (ekk_instance_.dual_ray_record_.value.size()) {
        // Dual ray is already computed
        highsLogUser(options_.log_options, HighsLogType::kInfo,
                     "Copying known dual ray\n");
        for (HighsInt iRow = 0; iRow < num_row; iRow++)
          dual_ray_value[iRow] = ekk_instance_.dual_ray_record_.value[iRow];
      } else if (has_invert) {
        // Dual ray is known and can be calculated
        highsLogUser(options_.log_options, HighsLogType::kInfo,
                     "Solving linear system to compute dual ray\n");
        vector<double> rhs;
        HighsInt iRow = ekk_instance_.dual_ray_record_.index;
        rhs.assign(num_row, 0);
        rhs[iRow] = ekk_instance_.dual_ray_record_.sign;
        HighsInt* dual_ray_num_nz = 0;
        basisSolveInterface(rhs, dual_ray_value, dual_ray_num_nz, NULL, true);
        // Now save the dual ray itself
        ekk_instance_.dual_ray_record_.value.resize(num_row);
        for (HighsInt iRow = 0; iRow < num_row; iRow++)
          ekk_instance_.dual_ray_record_.value[iRow] = dual_ray_value[iRow];
      } else {
        assert(!has_invert);
        // Dual ray is known but cannot be calculated
        highsLogUser(options_.log_options, HighsLogType::kError,
                     "No LP invertible representation to compute dual ray\n");
        return_status = HighsStatus::kError;
      }
    } else {
      highsLogUser(options_.log_options, HighsLogType::kInfo,
                   "No dual ray found\n");
      return_status = HighsStatus::kOk;
    }
  }
  if (solve_feasibility_problem) {
    // Feasibility problem has been solved, so any objective-related
    // information has been lost. Reverting the objective function via
    // Highs calls clears info_, so better to just copy the data
    // directly and set the info_ entries that are no longer valid
    lp.col_cost_ = col_cost;
    if (is_qp) model_.hessian_ = hessian;
    this->setOptionValue("presolve", presolve);
    this->setOptionValue("solve_relaxation", solve_relaxation);
    // Modify the objective-related information
    this->info_.dual_solution_status = SolutionStatus::kSolutionStatusNone;
    this->info_.objective_function_value = 0;
    this->info_.num_dual_infeasibilities = kHighsIllegalInfeasibilityCount;
    this->info_.max_dual_infeasibility = kHighsIllegalInfeasibilityMeasure;
    this->info_.sum_dual_infeasibilities = kHighsIllegalInfeasibilityMeasure;
    this->info_.max_complementarity_violation =
        kHighsIllegalComplementarityViolation;
    this->info_.sum_complementarity_violations =
        kHighsIllegalComplementarityViolation;
    if (has_dual_ray) {
      assert(this->info_.num_primal_infeasibilities > 0);
      assert(this->model_status_ == HighsModelStatus::kInfeasible);
    } else {
      // If someone has tried to get a dual ray for a feasible
      // problem, then any status of the original model has been lost
      this->model_status_ = HighsModelStatus::kNotset;
    }
  }
  return return_status;
}